

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O3

Shader * __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::Program::addShader
          (Program *this,ShaderType type,GLSLVersion version)

{
  pointer *pppSVar1;
  iterator __position;
  Shader *shader;
  Shader *local_28;
  
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::reserve(&this->m_shaders,
            ((long)(this->m_shaders).
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_shaders).
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  local_28 = (Shader *)operator_new(0x38);
  local_28->m_shaderType = type;
  local_28->m_version = version;
  (local_28->m_defaultBlock).variables.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->m_defaultBlock).variables.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->m_defaultBlock).variables.
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_28->m_defaultBlock).interfaceBlocks.
  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->m_defaultBlock).interfaceBlocks.
  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->m_defaultBlock).interfaceBlocks.
  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (this->m_shaders).
       super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_shaders).
      super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader*,std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader*>>
    ::_M_realloc_insert<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader*const&>
              ((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader*,std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader*>>
                *)&this->m_shaders,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppSVar1 = &(this->m_shaders).
                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return local_28;
}

Assistant:

Shader* Program::addShader (glu::ShaderType type, glu::GLSLVersion version)
{
	DE_ASSERT(type < glu::SHADERTYPE_LAST);

	Shader* shader;

	// make sure push_back() cannot throw
	m_shaders.reserve(m_shaders.size() + 1);

	shader = new Shader(type, version);
	m_shaders.push_back(shader);

	return shader;
}